

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLogger.cpp
# Opt level: O0

void __thiscall Js::MemoryLogger::MemoryLogger(MemoryLogger *this,TAllocator *alloc,ULONG count)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  char16_t **ppcVar2;
  TrackAllocData local_48;
  ULONG local_1c;
  TAllocator *pTStack_18;
  ULONG count_local;
  TAllocator *alloc_local;
  MemoryLogger *this_local;
  
  local_1c = count;
  pTStack_18 = alloc;
  alloc_local = (TAllocator *)this;
  ILogger::ILogger(&this->super_ILogger);
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR_Write_01ddf198;
  this->m_current = 0;
  this->m_capacity = local_1c;
  this->m_alloc = pTStack_18;
  CriticalSection::CriticalSection(&this->m_criticalSection,0);
  pAVar1 = &this->m_alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&char16_t*::typeinfo,0,(ulong)this->m_capacity,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MemoryLogger.cpp"
             ,0xd);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_48);
  ppcVar2 = Memory::AllocateArray<Memory::ArenaAllocator,char16_t*,false>
                      ((Memory *)pAVar1,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                       (ulong)this->m_capacity);
  this->m_log = ppcVar2;
  return;
}

Assistant:

MemoryLogger::MemoryLogger(TAllocator* alloc, ULONG count) : m_alloc(alloc), m_capacity(count), m_current(0)
    {
        m_log = AnewArrayZ(m_alloc, char16*, m_capacity);
    }